

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::DatePartCachedFunction<duckdb::DatePart::MonthOperator,duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  int64_t *piVar1;
  int64_t *piVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  data_ptr_t pdVar6;
  _func_int *p_Var7;
  SelectionVector *pSVar8;
  FunctionLocalState *pFVar9;
  reference vector;
  idx_t iVar10;
  int64_t iVar11;
  ulong idx;
  ulong uVar12;
  idx_t i;
  ulong uVar13;
  idx_t iVar14;
  ulong idx_00;
  ValidityMask *pVVar15;
  ulong uVar16;
  UnifiedVectorFormat local_78;
  
  local_78.sel = (SelectionVector *)state[1]._vptr_ExpressionState;
  pFVar9 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->
                     ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_78);
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  count = args->count;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar6 = result->data;
    pdVar4 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    pVVar15 = &result->validity;
    if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
        iVar11 = DateLookupCache<duckdb::DatePart::MonthOperator>::ExtractElement
                           ((DateLookupCache<duckdb::DatePart::MonthOperator> *)(pFVar9 + 1),
                            (timestamp_t)*(int64_t *)(pdVar4 + iVar14 * 8),pVVar15,iVar14);
        *(int64_t *)(pdVar6 + iVar14 * 8) = iVar11;
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::Copy
                (&pVVar15->super_TemplatedValidityMask<unsigned_long>,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>,count);
      idx_00 = 0;
      for (uVar12 = 0; uVar12 != count + 0x3f >> 6; uVar12 = uVar12 + 1) {
        puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          uVar13 = idx_00 + 0x40;
          if (count <= idx_00 + 0x40) {
            uVar13 = count;
          }
LAB_00c5cf94:
          for (; idx = idx_00, idx_00 < uVar13; idx_00 = idx_00 + 1) {
            iVar11 = DateLookupCache<duckdb::DatePart::MonthOperator>::ExtractElement
                               ((DateLookupCache<duckdb::DatePart::MonthOperator> *)(pFVar9 + 1),
                                (timestamp_t)*(int64_t *)(pdVar4 + idx_00 * 8),pVVar15,idx_00);
            *(int64_t *)(pdVar6 + idx_00 * 8) = iVar11;
          }
        }
        else {
          uVar5 = puVar3[uVar12];
          uVar13 = idx_00 + 0x40;
          if (count <= idx_00 + 0x40) {
            uVar13 = count;
          }
          if (uVar5 == 0xffffffffffffffff) goto LAB_00c5cf94;
          idx = uVar13;
          if (uVar5 != 0) {
            for (uVar16 = 0; idx = uVar16 + idx_00, idx < uVar13; uVar16 = uVar16 + 1) {
              if ((uVar5 >> (uVar16 & 0x3f) & 1) != 0) {
                iVar11 = DateLookupCache<duckdb::DatePart::MonthOperator>::ExtractElement
                                   ((DateLookupCache<duckdb::DatePart::MonthOperator> *)(pFVar9 + 1)
                                    ,(timestamp_t)*(int64_t *)(pdVar4 + uVar16 * 8 + idx_00 * 8),
                                    pVVar15,idx);
                *(int64_t *)(pdVar6 + uVar16 * 8 + idx_00 * 8) = iVar11;
              }
            }
          }
        }
        idx_00 = idx;
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    piVar1 = (int64_t *)result->data;
    piVar2 = (int64_t *)vector->data;
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      iVar11 = DateLookupCache<duckdb::DatePart::MonthOperator>::ExtractElement
                         ((DateLookupCache<duckdb::DatePart::MonthOperator> *)(pFVar9 + 1),
                          (timestamp_t)*piVar2,&result->validity,0);
      *piVar1 = iVar11;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pSVar8 = local_78.sel;
    pdVar6 = result->data;
    FlatVector::VerifyFlatVector(result);
    pVVar15 = &result->validity;
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
        p_Var7 = (_func_int *)pSVar8->sel_vector;
        iVar10 = iVar14;
        if (p_Var7 != (_func_int *)0x0) {
          iVar10 = (idx_t)*(uint *)(p_Var7 + iVar14 * 4);
        }
        iVar11 = DateLookupCache<duckdb::DatePart::MonthOperator>::ExtractElement
                           ((DateLookupCache<duckdb::DatePart::MonthOperator> *)(pFVar9 + 1),
                            (timestamp_t)*(int64_t *)(local_78.data + iVar10 * 8),pVVar15,iVar14);
        *(int64_t *)(pdVar6 + iVar14 * 8) = iVar11;
      }
    }
    else {
      for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
        p_Var7 = (_func_int *)pSVar8->sel_vector;
        iVar10 = iVar14;
        if (p_Var7 != (_func_int *)0x0) {
          iVar10 = (idx_t)*(uint *)(p_Var7 + iVar14 * 4);
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar10 >> 6]
             >> (iVar10 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar14);
        }
        else {
          iVar11 = DateLookupCache<duckdb::DatePart::MonthOperator>::ExtractElement
                             ((DateLookupCache<duckdb::DatePart::MonthOperator> *)(pFVar9 + 1),
                              (timestamp_t)*(int64_t *)(local_78.data + iVar10 * 8),pVVar15,iVar14);
          *(int64_t *)(pdVar6 + iVar14 * 8) = iVar11;
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  return;
}

Assistant:

static void DatePartCachedFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<DateCacheLocalState<OP>>();
	UnaryExecutor::ExecuteWithNulls<T, int64_t>(
	    args.data[0], result, args.size(),
	    [&](T input, ValidityMask &mask, idx_t idx) { return lstate.cache.ExtractElement(input, mask, idx); });
}